

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::learn_empty_clause(Internal *this)

{
  pointer puVar1;
  uint64_t local_18;
  
  build_chain_for_empty(this);
  External::check_learned_empty_clause(this->external);
  local_18 = this->clause_id + 1;
  this->clause_id = local_18;
  if (this->proof != (Proof *)0x0) {
    Proof::add_derived_empty_clause(this->proof,local_18,&this->lrat_chain);
  }
  this->unsat = true;
  this->conflict_id = local_18;
  this->marked_failed = true;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->conclusion,&local_18);
  puVar1 = (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void Internal::learn_empty_clause () {
  assert (!unsat);
  build_chain_for_empty ();
  LOG ("learned empty clause");
  external->check_learned_empty_clause ();
  int64_t id = ++clause_id;
  if (proof) {
    proof->add_derived_empty_clause (id, lrat_chain);
  }
  unsat = true;
  conflict_id = id;
  marked_failed = true;
  conclusion.push_back (id);
  lrat_chain.clear ();
}